

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceStore.cpp
# Opt level: O2

void __thiscall Kernel::InferenceStore::ProofPrinter::print(ProofPrinter *this)

{
  Unit **ppUVar1;
  
  while (ppUVar1 = (this->outKernel)._cursor, ppUVar1 != (this->outKernel)._stack) {
    (this->outKernel)._cursor = ppUVar1 + -1;
    handleStep(this,ppUVar1[-1]);
  }
  if (this->delayPrinting == true) {
    printDelayed(this);
    return;
  }
  return;
}

Assistant:

virtual void print()
  {
    while(outKernel.isNonEmpty()) {
      Unit* cs=outKernel.pop();
      handleStep(cs);
    }
    if(delayPrinting) printDelayed();
  }